

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O3

void __thiscall
vkt::geometry::GraphicsPipelineBuilder::~GraphicsPipelineBuilder(GraphicsPipelineBuilder *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  VkShaderModule VVar4;
  
  pVVar1 = (this->m_vertexInputAttributes).
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_vertexInputAttributes).
                                 super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar2 = (this->m_vertexInputBindings).
           super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_vertexInputBindings).
                                 super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  pVVar3 = (this->m_shaderStages).
           super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->m_shaderStages).
                                 super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  VVar4.m_internal =
       (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter,VVar4);
  }
  (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_device = (VkDevice)0x0;
  (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_tessEvaluationShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_deviceIface = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter,VVar4);
  }
  (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_tessControlShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .deleter,VVar4);
  }
  (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_geometryShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .deleter,VVar4);
  }
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar4);
  }
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  return;
}

Assistant:

GraphicsPipelineBuilder	(void) : m_renderSize			(0, 0)
															   , m_shaderStageFlags		(0u)
															   , m_cullModeFlags		(vk::VK_CULL_MODE_NONE)
															   , m_frontFace			(vk::VK_FRONT_FACE_COUNTER_CLOCKWISE)
															   , m_patchControlPoints	(1u)
															   , m_blendEnable			(false)
															   , m_primitiveTopology	(vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {}